

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanObjectWrappers.hpp
# Opt level: O1

void __thiscall
VulkanUtilities::
VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>::
Release(VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>
        *this)

{
  VulkanLogicalDevice *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  
  this_00 = (this->m_pLogicalDevice).
            super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if ((this_00 != (VulkanLogicalDevice *)0x0) &&
     (this->m_VkObject != (VkAccelerationStructureKHR_T *)0x0)) {
    VulkanLogicalDevice::ReleaseVulkanObject(this_00,this);
  }
  (this->m_pLogicalDevice).
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  this_01 = (this->m_pLogicalDevice).
            super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (this->m_pLogicalDevice).
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_VkObject = (VkAccelerationStructureKHR_T *)0x0;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    return;
  }
  return;
}

Assistant:

void Release()
    {
        // For externally managed objects, m_pLogicalDevice is null
        if (m_pLogicalDevice && m_VkObject != VK_NULL_HANDLE)
        {
            m_pLogicalDevice->ReleaseVulkanObject(std::move(*this));
        }
        m_VkObject = VK_NULL_HANDLE;
        m_pLogicalDevice.reset();
    }